

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O0

void parse_fd_array(CID_Face face,CID_Parser *parser)

{
  ulong uVar1;
  FT_Realloc_Func p_Var2;
  CID_FaceDict dict;
  FT_UInt n;
  FT_Long max_dicts;
  FT_Long num_dicts;
  FT_Stream pFStack_30;
  FT_Error error;
  FT_Stream stream;
  FT_Memory memory;
  CID_FaceInfo cid;
  CID_Parser *parser_local;
  CID_Face face_local;
  
  memory = (FT_Memory)&face->cid;
  stream = (FT_Stream)(face->root).memory;
  pFStack_30 = parser->stream;
  num_dicts._4_4_ = 0;
  cid = (CID_FaceInfo)parser;
  parser_local = (CID_Parser *)face;
  max_dicts = (*(parser->root).funcs.to_int)(&parser->root);
  if ((-1 < max_dicts) && (max_dicts < 0x80000000)) {
    uVar1 = pFStack_30->size / 100;
    if ((long)uVar1 < max_dicts) {
      max_dicts = uVar1;
    }
    if (memory[9].realloc == (FT_Realloc_Func)0x0) {
      p_Var2 = (FT_Realloc_Func)
               ft_mem_realloc((FT_Memory)stream,0x150,0,max_dicts,(void *)0x0,
                              (FT_Error *)((long)&num_dicts + 4));
      memory[9].realloc = p_Var2;
      if (num_dicts._4_4_ == 0) {
        *(int *)&memory[9].free = (int)max_dicts;
        for (dict._4_4_ = 0; dict._4_4_ < *(uint *)&memory[9].free; dict._4_4_ = dict._4_4_ + 1) {
          p_Var2 = memory[9].realloc;
          *(undefined4 *)(p_Var2 + (ulong)dict._4_4_ * 0x150 + 0x78) = 7;
          *(undefined4 *)(p_Var2 + (ulong)dict._4_4_ * 0x150 + 0x7c) = 1;
          *(undefined4 *)(p_Var2 + (ulong)dict._4_4_ * 0x150 + 4) = 4;
          *(undefined8 *)(p_Var2 + (ulong)dict._4_4_ * 0x150 + 0xc0) = 0xf5c;
          *(undefined8 *)(p_Var2 + (ulong)dict._4_4_ * 0x150 + 0x70) = 0x27a000;
        }
      }
    }
  }
  return;
}

Assistant:

FT_CALLBACK_DEF( void )
  parse_fd_array( CID_Face     face,
                  CID_Parser*  parser )
  {
    CID_FaceInfo  cid    = &face->cid;
    FT_Memory     memory = face->root.memory;
    FT_Stream     stream = parser->stream;
    FT_Error      error  = FT_Err_Ok;
    FT_Long       num_dicts, max_dicts;


    num_dicts = cid_parser_to_int( parser );
    if ( num_dicts < 0 || num_dicts > FT_INT_MAX )
    {
      FT_ERROR(( "parse_fd_array: invalid number of dictionaries\n" ));
      goto Exit;
    }

    FT_TRACE4(( " %ld\n", num_dicts ));

    /*
     * A single entry in the FDArray must (at least) contain the following
     * structure elements.
     *
     *   %ADOBeginFontDict              18
     *   X dict begin                   13
     *     /FontMatrix [X X X X]        22
     *     /Private X dict begin        22
     *     end                           4
     *   end                             4
     *   %ADOEndFontDict                16
     *
     * This needs 18+13+22+22+4+4+16=99 bytes or more.  Normally, you also
     * need a `dup X' at the very beginning and a `put' at the end, so a
     * rough guess using 100 bytes as the minimum is justified.
     */
    max_dicts = (FT_Long)( stream->size / 100 );
    if ( num_dicts > max_dicts )
    {
      FT_TRACE0(( "parse_fd_array: adjusting FDArray size"
                  " (from %ld to %ld)\n",
                  num_dicts, max_dicts ));
      num_dicts = max_dicts;
    }

    if ( !cid->font_dicts )
    {
      FT_UInt  n;


      if ( FT_NEW_ARRAY( cid->font_dicts, num_dicts ) )
        goto Exit;

      cid->num_dicts = num_dicts;

      /* set some default values (the same as for Type 1 fonts) */
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        CID_FaceDict  dict = cid->font_dicts + n;


        dict->private_dict.blue_shift       = 7;
        dict->private_dict.blue_fuzz        = 1;
        dict->private_dict.lenIV            = 4;
        dict->private_dict.expansion_factor = (FT_Fixed)( 0.06 * 0x10000L );
        dict->private_dict.blue_scale       = (FT_Fixed)(
                                                0.039625 * 0x10000L * 1000 );
      }
    }

  Exit:
    return;
  }